

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O3

int GetNMEASentenceublox(UBLOX *publox,NMEADATA *pNMEAData)

{
  UBLOX *pUVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int buflen;
  char *pcVar10;
  char talkerid [3];
  int sentencelen;
  char mnemonic [6];
  int nbBytesToRequest;
  CHRONO chrono;
  char recvbuf [4096];
  char local_10b4 [4];
  int local_10b0;
  int local_10ac;
  char local_10a8 [8];
  UBLOX *local_10a0;
  timespec local_1098;
  NMEADATA *local_1088;
  timespec local_1080;
  undefined8 local_1070;
  undefined8 uStack_1068;
  long local_1060;
  long lStack_1058;
  timespec local_1050;
  int local_1040;
  char local_1038 [4104];
  
  local_10b0 = 0;
  iVar2 = clock_getres(4,&local_1050);
  if ((iVar2 == 0) && (iVar2 = clock_gettime(4,&local_1080), iVar2 == 0)) {
    local_1040 = 0;
    local_1070 = 0;
    uStack_1068 = 0;
    local_1060 = 0;
    lStack_1058 = 0;
  }
  uVar7 = 0;
  memset(local_1038,0,0x1000);
  iVar2 = (publox->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (publox->RS232Port).s;
    do {
      sVar4 = recv(iVar2,local_1038 + uVar7,(ulong)(3 - (int)uVar7),0);
      if ((int)sVar4 < 1) goto LAB_00117d56;
      uVar6 = (int)uVar7 + (int)sVar4;
      uVar7 = (ulong)uVar6;
    } while ((int)uVar6 < 3);
  }
  else {
    if (iVar2 != 0) {
LAB_00117d56:
      puts("Error reading data from a ublox. ");
      return 1;
    }
    iVar2 = *(int *)&(publox->RS232Port).hDev;
    uVar7 = 0;
    do {
      sVar4 = read(iVar2,local_1038 + uVar7,(ulong)(3 - (int)uVar7));
      if ((int)sVar4 < 1) goto LAB_00117d56;
      uVar6 = (int)uVar7 + (int)sVar4;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < 3);
  }
  local_1088 = pNMEAData;
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_1038,3,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  iVar2 = 3;
  local_10a0 = publox;
  do {
    pcVar10 = local_1038;
    local_10b4[0] = '\0';
    local_10b4[1] = '\0';
    local_10b4[2] = 0;
    local_10a8[0] = '\0';
    local_10a8[1] = '\0';
    local_10a8[2] = '\0';
    local_10a8[3] = '\0';
    local_10a8[4] = '\0';
    local_10a8[5] = '\0';
    local_1098.tv_sec._0_4_ = 0xffffffff;
    local_10ac = 0;
    uVar6 = 0;
    do {
      buflen = iVar2 - uVar6;
      iVar3 = AnalyzeSentenceNMEA(pcVar10,buflen,local_10b4,local_10a8,&local_10b0,
                                  (int *)&local_1098,&local_10ac);
      if (iVar3 == 0) {
        if (0 < (int)(iVar2 - (uVar6 + local_10b0))) {
          puts("Warning getting data from a ublox : Unexpected data after a sentence. ");
        }
        iVar2 = ProcessSentenceNMEA(pcVar10,local_10b0,local_10b4,local_10a8,local_1088);
        return (uint)(iVar2 != 0);
      }
      uVar9 = (uint)local_1098.tv_sec;
      if (iVar3 == 6) goto LAB_00117b68;
      pcVar10 = pcVar10 + local_10ac;
      uVar6 = uVar6 + local_10ac;
      buflen = iVar2 - uVar6;
    } while (buflen != 0 && (int)uVar6 <= iVar2);
    uVar9 = 3;
    if ((int)uVar6 < 3) {
      uVar9 = uVar6;
    }
LAB_00117b68:
    memmove(local_1038,local_1038 + (int)uVar6,(long)buflen);
    iVar2 = buflen + uVar9;
    if (0xfff < iVar2) {
      puts("Error reading data from a ublox : Invalid data. ");
      return 4;
    }
    pcVar10 = local_1038 + buflen;
    iVar3 = (local_10a0->RS232Port).DevType;
    if (iVar3 - 1U < 4) {
      if (0 < (int)uVar9) {
        iVar3 = (local_10a0->RS232Port).s;
        uVar7 = 0;
        do {
          sVar4 = recv(iVar3,pcVar10 + uVar7,(long)(int)(uVar9 - (int)uVar7),0);
          if ((int)sVar4 < 1) goto LAB_00117d56;
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while ((int)uVar6 < (int)uVar9);
      }
    }
    else {
      if (iVar3 != 0) goto LAB_00117d56;
      if (uVar9 != 0) {
        iVar3 = *(int *)&(local_10a0->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar4 = read(iVar3,pcVar10 + uVar7,(ulong)(uVar9 - (int)uVar7));
          if ((int)sVar4 < 1) goto LAB_00117d56;
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while (uVar6 < uVar9);
      }
    }
    pUVar1 = local_10a0;
    if ((local_10a0->bSaveRawData != 0) && ((FILE *)local_10a0->pfSaveFile != (FILE *)0x0)) {
      fwrite(pcVar10,(long)(int)uVar9,1,(FILE *)local_10a0->pfSaveFile);
      fflush((FILE *)pUVar1->pfSaveFile);
    }
    lVar8 = local_1060;
    lVar5 = lStack_1058;
    if (local_1040 == 0) {
      clock_gettime(4,&local_1098);
      lVar8 = ((CONCAT44(local_1098.tv_sec._4_4_,(uint)local_1098.tv_sec) + local_1060) -
              local_1080.tv_sec) + (local_1098.tv_nsec + lStack_1058) / 1000000000;
      lVar5 = (local_1098.tv_nsec + lStack_1058) % 1000000000 - local_1080.tv_nsec;
      if (lVar5 < 0) {
        lVar8 = lVar8 + ~((ulong)-lVar5 / 1000000000);
        lVar5 = lVar5 + 1000000000 + ((ulong)-lVar5 / 1000000000) * 1000000000;
      }
    }
    if (4.0 < (double)lVar5 / 1000000000.0 + (double)lVar8) {
      puts("Error reading data from a ublox : Sentence timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetNMEASentenceublox(UBLOX* publox, NMEADATA* pNMEAData)
{
	char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	char* ptr = NULL;
	int sentencelen = 0;
	char talkerid[MAX_NB_BYTES_TALKER_ID_NMEA+1]; // +1 for the null terminator character for strings.
	char mnemonic[MAX_NB_BYTES_MNEMONIC_NMEA+1]; // +1 for the null terminator character for strings.
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA;
	if (ReadAllRS232Port(&publox->RS232Port, (uint8*)recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		memset(talkerid, 0, sizeof(talkerid));
		memset(mnemonic, 0, sizeof(mnemonic));
		res = FindSentenceNMEA(recvbuf, BytesReceived, talkerid, mnemonic, &sentencelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_NB_BYTES_SENTENCE_NMEA, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, (uint8*)recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Sentence timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-sentencelen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a sentence. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *psentencelen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*psentencelen > 0)
	//{
	//	memcpy(databuf, ptr, *psentencelen);
	//}

	if (ProcessSentenceNMEA(ptr, sentencelen, talkerid, mnemonic, pNMEAData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}